

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O3

lightlist_t * P_GetPlaneLight(sector_t *sector,secplane_t *plane,bool underside)

{
  uint uVar1;
  lightlist_t *plVar2;
  double dVar3;
  double dVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  double *pdVar6;
  double dVar7;
  
  dVar3 = (sector->centerspot).X;
  dVar4 = (sector->centerspot).Y;
  dVar7 = (dVar4 * (plane->normal).Y + (plane->normal).X * dVar3 + plane->D) * plane->negiC;
  if ((int)CONCAT71(in_register_00000011,underside) != 0) {
    dVar7 = dVar7 + -1.52587890625e-05;
  }
  uVar1 = (sector->e->XFloor).lightlist.Count;
  plVar2 = (sector->e->XFloor).lightlist.Array;
  if (1 < (ulong)uVar1) {
    pdVar6 = &plVar2[1].plane.negiC;
    uVar5 = 0;
    do {
      if ((pdVar6[-3] * dVar4 + pdVar6[-1] + (((secplane_t *)(pdVar6 + -4))->normal).X * dVar3) *
          *pdVar6 <= dVar7) goto LAB_004fdd94;
      uVar5 = uVar5 + 1;
      pdVar6 = pdVar6 + 10;
    } while ((ulong)uVar1 - 1 != uVar5);
  }
  uVar5 = (ulong)(uVar1 - 1);
LAB_004fdd94:
  return plVar2 + uVar5;
}

Assistant:

lightlist_t * P_GetPlaneLight(sector_t * sector, secplane_t * plane, bool underside)
{
	unsigned   i;
	TArray<lightlist_t> &lightlist = sector->e->XFloor.lightlist;

	double planeheight=plane->ZatPoint(sector->centerspot);
	if(underside) planeheight-= EQUAL_EPSILON;
	
	for(i = 1; i < lightlist.Size(); i++)
		if (lightlist[i].plane.ZatPoint(sector->centerspot) <= planeheight) 
			return &lightlist[i - 1];
		
	return &lightlist[lightlist.Size() - 1];
}